

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> * __thiscall
flow::convert<flow::util::Cidr,flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>
          (vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *__return_storage_ptr__,
          flow *this,vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source)

{
  size_type __n;
  const_reference ppCVar1;
  reference this_00;
  Cidr local_90;
  size_type local_40;
  size_t e;
  size_t i;
  allocator<flow::util::Cidr> local_1a;
  undefined1 local_19;
  flow *local_18;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source_local;
  vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *target;
  
  local_19 = 0;
  local_18 = this;
  source_local = (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                 __return_storage_ptr__;
  __n = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::size
                  ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)this);
  std::allocator<flow::util::Cidr>::allocator(&local_1a);
  std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::vector
            (__return_storage_ptr__,__n,&local_1a);
  std::allocator<flow::util::Cidr>::~allocator(&local_1a);
  e = 0;
  local_40 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::size
                       ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)local_18);
  for (; e != local_40; e = e + 1) {
    ppCVar1 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::operator[]
                        ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)local_18,e);
    ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>::get
              (&local_90,(ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)*ppCVar1);
    this_00 = std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::operator[]
                        (__return_storage_ptr__,e);
    util::Cidr::operator=(this_00,&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> convert(const std::vector<Constant*>& source) {
  std::vector<T> target(source.size());

  for (size_t i = 0, e = source.size(); i != e; ++i)
    target[i] = static_cast<S*>(source[i])->get();

  return target;
}